

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::operator==(Value *this,Value *other)

{
  int iVar1;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *__x;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *pmVar2;
  ulong uVar3;
  double *in_RSI;
  double *in_RDI;
  int comp;
  char *other_str;
  char *this_str;
  uint other_len;
  uint this_len;
  int temp;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffff98;
  uint *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  void *local_38;
  void *local_30;
  uint local_24;
  uint local_20;
  bool local_1;
  
  if ((*(ushort *)(in_RDI + 1) & 0xff) == (*(ushort *)(in_RSI + 1) & 0xff)) {
    uVar3 = (ulong)*(byte *)(in_RDI + 1);
    switch(uVar3) {
    case 0:
      local_1 = true;
      break;
    case 1:
      local_1 = *in_RDI == *in_RSI;
      break;
    case 2:
      local_1 = *in_RDI == *in_RSI;
      break;
    case 3:
      local_1 = *in_RDI == *in_RSI;
      break;
    case 4:
      if ((*in_RDI == 0.0) || (*in_RSI == 0.0)) {
        local_1 = *in_RDI == *in_RSI;
      }
      else {
        decodePrefixedString
                  (false,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                   in_stack_ffffffffffffffa0,(char **)in_stack_ffffffffffffff98);
        decodePrefixedString
                  (SUB81(uVar3 >> 0x38,0),
                   (char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                   in_stack_ffffffffffffffa0,(char **)in_stack_ffffffffffffff98);
        if (local_20 == local_24) {
          iVar1 = memcmp(local_30,local_38,(ulong)local_20);
          local_1 = iVar1 == 0;
        }
        else {
          local_1 = false;
        }
      }
      break;
    case 5:
      local_1 = (*(byte *)in_RDI & 1) == (*(byte *)in_RSI & 1);
      break;
    case 6:
    case 7:
      __x = (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
             *)std::
               map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
               ::size((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                       *)0x157d23);
      pmVar2 = (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                *)std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::size((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                          *)0x157d35);
      local_1 = false;
      if (__x == pmVar2) {
        local_1 = std::operator==(__x,in_stack_ffffffffffffff98);
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_value.cpp"
                    ,0x250,"bool Json::Value::operator==(const Value &) const");
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Value::operator==(const Value& other) const {
  // if ( type_ != other.type_ )
  // GCC 2.95.3 says:
  // attempt to take address of bit-field structure member `Json::Value::type_'
  // Beats me, but a temp solves the problem.
  int temp = other.type_;
  if (type_ != temp)
    return false;
  switch (type_) {
  case nullValue:
    return true;
  case intValue:
    return value_.int_ == other.value_.int_;
  case uintValue:
    return value_.uint_ == other.value_.uint_;
  case realValue:
    return value_.real_ == other.value_.real_;
  case booleanValue:
    return value_.bool_ == other.value_.bool_;
  case stringValue:
  {
    if ((value_.string_ == 0) || (other.value_.string_ == 0)) {
      return (value_.string_ == other.value_.string_);
    }
    unsigned this_len;
    unsigned other_len;
    char const* this_str;
    char const* other_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    decodePrefixedString(other.allocated_, other.value_.string_, &other_len, &other_str);
    if (this_len != other_len) return false;
    int comp = memcmp(this_str, other_str, this_len);
    return comp == 0;
  }
  case arrayValue:
  case objectValue:
    return value_.map_->size() == other.value_.map_->size() &&
           (*value_.map_) == (*other.value_.map_);
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}